

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O0

void __thiscall
flatbuffers::csharp::CSharpGenerator::GenStructPackDecl_ObjectAPI
          (CSharpGenerator *this,StructDef *struct_def,string *code_ptr,
          vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
          *array_lengths)

{
  FieldDef *pFVar1;
  ulong uVar2;
  size_t sVar3;
  unsigned_long t;
  undefined8 uVar4;
  bool bVar5;
  reference ppFVar6;
  size_type_conflict sVar7;
  reference pvVar8;
  string local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  ulong local_4b0;
  size_t i_7;
  size_t i_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  string local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  unsigned_long local_400;
  size_t j;
  size_t i_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  string local_390;
  undefined1 local_370 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> idx_1;
  size_t i_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  string local_228;
  undefined1 local_208 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> idx;
  size_t i_3;
  ulong local_1c0;
  size_t i_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  ulong local_f8;
  size_t i_1;
  string name;
  size_t i;
  vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
  array_only_lengths;
  undefined1 local_a0 [8];
  FieldArrayLength tmp_array_length;
  StructDef *local_70;
  ushort local_60;
  Type *field_type;
  bool is_array;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_38;
  const_iterator it;
  string *code;
  vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
  *array_lengths_local;
  string *code_ptr_local;
  StructDef *struct_def_local;
  CSharpGenerator *this_local;
  
  it._M_current = (FieldDef **)code_ptr;
  local_38._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 (&(struct_def->fields).vec);
  while( true ) {
    field = (FieldDef *)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      (&(struct_def->fields).vec);
    bVar5 = __gnu_cxx::operator!=
                      (&local_38,
                       (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field);
    if (!bVar5) break;
    ppFVar6 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_38);
    pFVar1 = *ppFVar6;
    bVar5 = IsArray(&(pFVar1->value).type);
    if (bVar5) {
      Type::VectorType((Type *)&tmp_array_length.length,&(pFVar1->value).type);
    }
    else {
      tmp_array_length.length = (pFVar1->value).type.base_type;
      tmp_array_length._36_4_ = (pFVar1->value).type.element;
      local_70 = (pFVar1->value).type.struct_def;
      local_60 = (pFVar1->value).type.fixed_length;
    }
    std::__cxx11::string::string((string *)local_a0,(string *)pFVar1);
    tmp_array_length.name.field_2._8_4_ = ZEXT24(local_60);
    std::
    vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
    ::push_back(array_lengths,(value_type *)local_a0);
    if (local_70 == (StructDef *)0x0) {
      std::
      vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
      ::vector((vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                *)&i);
      for (name.field_2._8_8_ = 0; uVar4 = name.field_2._8_8_,
          sVar7 = std::
                  vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                  ::size(array_lengths), (ulong)uVar4 < sVar7;
          name.field_2._8_8_ = name.field_2._8_8_ + 1) {
        pvVar8 = std::
                 vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                 ::operator[](array_lengths,name.field_2._8_8_);
        if (0 < pvVar8->length) {
          pvVar8 = std::
                   vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                   ::operator[](array_lengths,name.field_2._8_8_);
          std::
          vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
          ::push_back((vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                       *)&i,pvVar8);
        }
      }
      std::__cxx11::string::string((string *)&i_1);
      for (local_f8 = 0; uVar2 = local_f8,
          sVar7 = std::
                  vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                  ::size(array_lengths), uVar2 < sVar7; local_f8 = local_f8 + 1) {
        pvVar8 = std::
                 vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                 ::operator[](array_lengths,local_f8);
        std::operator+(&local_118,"_",&pvVar8->name);
        std::__cxx11::string::operator+=((string *)&i_1,(string *)&local_118);
        std::__cxx11::string::~string((string *)&local_118);
      }
      std::operator+(&local_158,"    var ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_1);
      std::operator+(&local_138,&local_158," = ");
      std::__cxx11::string::operator+=((string *)it._M_current,(string *)&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_158);
      sVar7 = std::
              vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
              ::size((vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                      *)&i);
      if (sVar7 == 0) {
        std::__cxx11::string::operator+=((string *)it._M_current,"_o");
        for (local_4b0 = 0; uVar2 = local_4b0,
            sVar7 = std::
                    vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                    ::size(array_lengths), uVar2 < sVar7; local_4b0 = local_4b0 + 1) {
          pvVar8 = std::
                   vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                   ::operator[](array_lengths,local_4b0);
          ConvertCase(&local_4f0,&pvVar8->name,kUpperCamel,kSnake);
          std::operator+(&local_4d0,".",&local_4f0);
          std::__cxx11::string::operator+=((string *)it._M_current,(string *)&local_4d0);
          std::__cxx11::string::~string((string *)&local_4d0);
          std::__cxx11::string::~string((string *)&local_4f0);
        }
        std::__cxx11::string::operator+=((string *)it._M_current,";");
      }
      else {
        GenTypeBasic_abi_cxx11_((string *)&i_2,this,(Type *)&tmp_array_length.length);
        std::operator+(&local_198,"new ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_2);
        std::operator+(&local_178,&local_198,"[");
        std::__cxx11::string::operator+=((string *)it._M_current,(string *)&local_178);
        std::__cxx11::string::~string((string *)&local_178);
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&i_2);
        for (local_1c0 = 0; uVar2 = local_1c0,
            sVar7 = std::
                    vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                    ::size((vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                            *)&i), uVar2 < sVar7; local_1c0 = local_1c0 + 1) {
          if (local_1c0 != 0) {
            std::__cxx11::string::operator+=((string *)it._M_current,",");
          }
          pvVar8 = std::
                   vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                   ::operator[]((vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                                 *)&i,local_1c0);
          NumToString<int>((string *)&i_3,pvVar8->length);
          std::__cxx11::string::operator+=((string *)it._M_current,(string *)&i_3);
          std::__cxx11::string::~string((string *)&i_3);
        }
        std::__cxx11::string::operator+=((string *)it._M_current,"];\n");
        std::__cxx11::string::operator+=((string *)it._M_current,"    ");
        for (idx.field_2._8_8_ = 0; uVar4 = idx.field_2._8_8_,
            sVar7 = std::
                    vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                    ::size((vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                            *)&i), (ulong)uVar4 < sVar7; idx.field_2._8_8_ = idx.field_2._8_8_ + 1)
        {
          NumToString<unsigned_long>(&local_228,idx.field_2._8_8_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_208,"idx",&local_228);
          std::__cxx11::string::~string((string *)&local_228);
          std::operator+(&local_328,"for (var ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_208);
          std::operator+(&local_308,&local_328," = 0; ");
          std::operator+(&local_2e8,&local_308,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_208);
          std::operator+(&local_2c8,&local_2e8," < ");
          pvVar8 = std::
                   vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                   ::operator[]((vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                                 *)&i,idx.field_2._8_8_);
          NumToString<int>((string *)&i_4,pvVar8->length);
          std::operator+(&local_2a8,&local_2c8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_4);
          std::operator+(&local_288,&local_2a8,"; ++");
          std::operator+(&local_268,&local_288,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_208);
          std::operator+(&local_248,&local_268,") {");
          std::__cxx11::string::operator+=((string *)it._M_current,(string *)&local_248);
          std::__cxx11::string::~string((string *)&local_248);
          std::__cxx11::string::~string((string *)&local_268);
          std::__cxx11::string::~string((string *)&local_288);
          std::__cxx11::string::~string((string *)&local_2a8);
          std::__cxx11::string::~string((string *)&i_4);
          std::__cxx11::string::~string((string *)&local_2c8);
          std::__cxx11::string::~string((string *)&local_2e8);
          std::__cxx11::string::~string((string *)&local_308);
          std::__cxx11::string::~string((string *)&local_328);
          std::__cxx11::string::~string((string *)local_208);
        }
        for (idx_1.field_2._8_8_ = 0; uVar4 = idx_1.field_2._8_8_,
            sVar7 = std::
                    vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                    ::size((vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                            *)&i), (ulong)uVar4 < sVar7;
            idx_1.field_2._8_8_ = idx_1.field_2._8_8_ + 1) {
          NumToString<unsigned_long>(&local_390,idx_1.field_2._8_8_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_370,"idx",&local_390);
          std::__cxx11::string::~string((string *)&local_390);
          if (idx_1.field_2._8_8_ == 0) {
            std::operator+(&local_3d0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_1
                           ,"[");
            std::operator+(&local_3b0,&local_3d0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_370);
            std::__cxx11::string::operator+=((string *)it._M_current,(string *)&local_3b0);
            std::__cxx11::string::~string((string *)&local_3b0);
            std::__cxx11::string::~string((string *)&local_3d0);
          }
          else {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_5
                           ,",",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_370);
            std::__cxx11::string::operator+=((string *)it._M_current,(string *)&i_5);
            std::__cxx11::string::~string((string *)&i_5);
          }
          std::__cxx11::string::~string((string *)local_370);
        }
        std::__cxx11::string::operator+=((string *)it._M_current,"] = _o");
        local_400 = 0;
        for (j = 0; sVar3 = j,
            sVar7 = std::
                    vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                    ::size(array_lengths), sVar3 < sVar7; j = j + 1) {
          pvVar8 = std::
                   vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                   ::operator[](array_lengths,j);
          ConvertCase(&local_440,&pvVar8->name,kUpperCamel,kSnake);
          std::operator+(&local_420,".",&local_440);
          std::__cxx11::string::operator+=((string *)it._M_current,(string *)&local_420);
          std::__cxx11::string::~string((string *)&local_420);
          std::__cxx11::string::~string((string *)&local_440);
          pvVar8 = std::
                   vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                   ::operator[](array_lengths,j);
          t = local_400;
          if (0 < pvVar8->length) {
            local_400 = local_400 + 1;
            NumToString<unsigned_long>((string *)&i_6,t);
            std::operator+(&local_480,"[idx",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_6
                          );
            std::operator+(&local_460,&local_480,"]");
            std::__cxx11::string::operator+=((string *)it._M_current,(string *)&local_460);
            std::__cxx11::string::~string((string *)&local_460);
            std::__cxx11::string::~string((string *)&local_480);
            std::__cxx11::string::~string((string *)&i_6);
          }
        }
        std::__cxx11::string::operator+=((string *)it._M_current,";");
        for (i_7 = 0; sVar3 = i_7,
            sVar7 = std::
                    vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                    ::size((vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                            *)&i), sVar3 < sVar7; i_7 = i_7 + 1) {
          std::__cxx11::string::operator+=((string *)it._M_current,"}");
        }
      }
      std::__cxx11::string::operator+=((string *)it._M_current,"\n");
      std::__cxx11::string::~string((string *)&i_1);
      std::
      vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
      ::~vector((vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                 *)&i);
    }
    else {
      GenStructPackDecl_ObjectAPI(this,local_70,code_ptr,array_lengths);
    }
    std::
    vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
    ::pop_back(array_lengths);
    FieldArrayLength::~FieldArrayLength((FieldArrayLength *)local_a0);
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_38);
  }
  return;
}

Assistant:

void GenStructPackDecl_ObjectAPI(
      const StructDef &struct_def, std::string *code_ptr,
      std::vector<FieldArrayLength> &array_lengths) const {
    auto &code = *code_ptr;
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      auto is_array = IsArray(field.value.type);
      const auto &field_type =
          is_array ? field.value.type.VectorType() : field.value.type;
      FieldArrayLength tmp_array_length = {
        field.name,
        field_type.fixed_length,
      };
      array_lengths.push_back(tmp_array_length);
      if (field_type.struct_def != nullptr) {
        GenStructPackDecl_ObjectAPI(*field_type.struct_def, code_ptr,
                                    array_lengths);
      } else {
        std::vector<FieldArrayLength> array_only_lengths;
        for (size_t i = 0; i < array_lengths.size(); ++i) {
          if (array_lengths[i].length > 0) {
            array_only_lengths.push_back(array_lengths[i]);
          }
        }
        std::string name;
        for (size_t i = 0; i < array_lengths.size(); ++i) {
          name += "_" + array_lengths[i].name;
        }
        code += "    var " + name + " = ";
        if (array_only_lengths.size() > 0) {
          code += "new " + GenTypeBasic(field_type) + "[";
          for (size_t i = 0; i < array_only_lengths.size(); ++i) {
            if (i != 0) { code += ","; }
            code += NumToString(array_only_lengths[i].length);
          }
          code += "];\n";
          code += "    ";
          // initialize array
          for (size_t i = 0; i < array_only_lengths.size(); ++i) {
            auto idx = "idx" + NumToString(i);
            code += "for (var " + idx + " = 0; " + idx + " < " +
                    NumToString(array_only_lengths[i].length) + "; ++" + idx +
                    ") {";
          }
          for (size_t i = 0; i < array_only_lengths.size(); ++i) {
            auto idx = "idx" + NumToString(i);
            if (i == 0) {
              code += name + "[" + idx;
            } else {
              code += "," + idx;
            }
          }
          code += "] = _o";
          for (size_t i = 0, j = 0; i < array_lengths.size(); ++i) {
            code += "." + ConvertCase(array_lengths[i].name, Case::kUpperCamel);
            if (array_lengths[i].length <= 0) continue;
            code += "[idx" + NumToString(j++) + "]";
          }
          code += ";";
          for (size_t i = 0; i < array_only_lengths.size(); ++i) {
            code += "}";
          }
        } else {
          code += "_o";
          for (size_t i = 0; i < array_lengths.size(); ++i) {
            code += "." + ConvertCase(array_lengths[i].name, Case::kUpperCamel);
          }
          code += ";";
        }
        code += "\n";
      }
      array_lengths.pop_back();
    }
  }